

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<float>::ensureHostBufferPopulated(ManagedBuffer<float> *this)

{
  bool bVar1;
  CanonicalDataSource CVar2;
  element_type *count;
  element_type *this_00;
  ManagedBuffer<float> *in_RDI;
  function<void_()> *in_stack_ffffffffffffff30;
  AttributeBuffer *in_stack_ffffffffffffff38;
  allocator *paVar3;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff40;
  allocator<char> local_89;
  string local_88 [16];
  ManagedBuffer<float> *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  CVar2 = currentCanonicalDataSource(in_stack_ffffffffffffff88);
  if (CVar2 != HostData) {
    if (CVar2 == NeedsCompute) {
      std::function<void_()>::operator()(in_stack_ffffffffffffff30);
    }
    else if (CVar2 == RenderBuffer) {
      bVar1 = deviceBufferTypeIsTexture(in_RDI);
      if (bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)&in_RDI->renderTextureBuffer);
        if (!bVar1) {
          paVar3 = &local_29;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_28,"render buffer should be allocated but isn\'t",paVar3);
          exception(in_stack_ffffffffffffff90);
          std::__cxx11::string::~string(local_28);
          std::allocator<char>::~allocator((allocator<char> *)&local_29);
        }
        paVar3 = &local_61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,"copy-back from texture not implemented yet",paVar3);
        exception(in_stack_ffffffffffffff90);
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)&in_RDI->renderAttributeBuffer);
        if (!bVar1) {
          in_stack_ffffffffffffff30 = (function<void_()> *)&local_89;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_88,"render buffer should be allocated but isn\'t",
                     (allocator *)in_stack_ffffffffffffff30);
          exception(in_stack_ffffffffffffff90);
          std::__cxx11::string::~string(local_88);
          std::allocator<char>::~allocator(&local_89);
        }
        count = std::
                __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)in_stack_ffffffffffffff30);
        this_00 = std::
                  __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x40c7c9);
        AttributeBuffer::getDataSize(this_00);
        getAttributeBufferDataRange<float>
                  (in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,(size_t)count);
        std::vector<float,_std::allocator<float>_>::operator=
                  (in_stack_ffffffffffffff40,
                   (vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff38);
        std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffff40);
      }
    }
  }
  return;
}

Assistant:

void ManagedBuffer<T>::ensureHostBufferPopulated() {

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    // good to go, nothing needs to be done
    break;

  case CanonicalDataSource::NeedsCompute:

    // compute it
    computeFunc();

    break;

  case CanonicalDataSource::RenderBuffer:

    if (deviceBufferTypeIsTexture()) {
      if (!renderTextureBuffer) exception("render buffer should be allocated but isn't");

      // copy the data back from the renderBuffer
      // TODO not implemented yet
      exception("copy-back from texture not implemented yet");
    } else {
      // sanity check
      if (!renderAttributeBuffer) exception("render buffer should be allocated but isn't");

      // copy the data back from the renderBuffer
      data = getAttributeBufferDataRange<T>(*renderAttributeBuffer, 0, renderAttributeBuffer->getDataSize());
    }

    break;
  };
}